

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBTree.cpp
# Opt level: O1

int __thiscall
chrono::collision::CHOBBTree::TraverseBoundingBoxes
          (CHOBBTree *this,
          _func_void_ChMatrix33<double>_ptr_Vector_ptr_Vector_ptr_int_void_ptr *callback,
          void *userdata)

{
  uint in_EAX;
  ulong uStack_28;
  int nboxes;
  
  uStack_28 = (ulong)in_EAX;
  if (TraverseBoundingBoxes(void(*)(chrono::ChMatrix33<double>&,chrono::ChVector<double>&,chrono::ChVector<double>&,int,void*),void*)
      ::mrot == '\0') {
    TraverseBoundingBoxes();
  }
  TraverseBoundingBoxes::mrot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  TraverseBoundingBoxes::mrot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  TraverseBoundingBoxes::mrot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  TraverseBoundingBoxes::mrot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  TraverseBoundingBoxes::mrot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  TraverseBoundingBoxes::mrot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  TraverseBoundingBoxes::mrot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  TraverseBoundingBoxes::mrot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  TraverseBoundingBoxes::mrot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  if (TraverseBoundingBoxes(void(*)(chrono::ChMatrix33<double>&,chrono::ChVector<double>&,chrono::ChVector<double>&,int,void*),void*)
      ::mpos == '\0') {
    TraverseBoundingBoxes();
  }
  TraverseBoundingBoxes::mpos.m_data[0] = VNULL;
  TraverseBoundingBoxes::mpos.m_data[1] = DAT_00b90ac0;
  TraverseBoundingBoxes::mpos.m_data[2] = DAT_00b90ac8;
  recurse_scan_OBBs(&TraverseBoundingBoxes::mrot,&TraverseBoundingBoxes::mpos,this,0,userdata,0,
                    &nboxes,callback);
  return nboxes;
}

Assistant:

int CHOBBTree::TraverseBoundingBoxes(
    void callback(ChMatrix33<>& Rot, Vector& Pos, Vector& d, int level, void* userdata),
    void* userdata) {
    int nboxes = 0;

    static ChMatrix33<> mrot;
    mrot.setIdentity();
    static Vector mpos;
    mpos = VNULL;

    recurse_scan_OBBs(mrot, mpos, this, 0, userdata, 0, nboxes, callback);

    return nboxes;
}